

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O1

UBool __thiscall icu_63::ICUServiceKey::isFallbackOf(ICUServiceKey *this,UnicodeString *id)

{
  ushort uVar1;
  short sVar2;
  byte bVar3;
  UBool UVar4;
  int len;
  int32_t iVar5;
  
  uVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      len = (id->fUnion).fFields.fLength;
    }
    else {
      len = (int)(short)uVar1 >> 5;
    }
    sVar2 = (this->_id).fUnion.fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar5 = (this->_id).fUnion.fFields.fLength;
    }
    else {
      iVar5 = (int)sVar2 >> 5;
    }
    bVar3 = 0;
    if ((((int)sVar2 & 1U) == 0) && (len == iVar5)) {
      UVar4 = icu_63::UnicodeString::doEquals(id,&this->_id,len);
      return UVar4 != '\0';
    }
  }
  else {
    bVar3 = *(byte *)&(this->_id).fUnion & 1;
  }
  return bVar3;
}

Assistant:

UBool 
ICUServiceKey::isFallbackOf(const UnicodeString& id) const 
{
    return id == _id;
}